

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O3

bool __thiscall QHstsStore::serializePolicy(QHstsStore *this,QString *key,QHstsPolicy *policy)

{
  char16_t *pcVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  longlong lVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QByteArray local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char *)0x0;
  local_98.d.size = 0;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_78,&local_98,2);
  QHstsPolicy::expiry((QHstsPolicy *)&local_58);
  lVar5 = QDateTime::toMSecsSinceEpoch();
  QDataStream::operator<<((QDataStream *)&local_78,lVar5);
  QDateTime::~QDateTime((QDateTime *)&local_58);
  bVar4 = QHstsPolicy::includesSubDomains(policy);
  QDataStream::operator<<((QDataStream *)&local_78,bVar4);
  cVar3 = local_68._3_1_;
  if (local_68._3_1_ == '\0') {
    pcVar1 = (key->d).ptr;
    uVar2 = (key->d).size;
    QVariant::QVariant(&local_58,&local_98);
    QVar6.m_size = (size_t)pcVar1;
    QVar6.field_0.m_data = &this->store;
    QSettings::setValue(QVar6,(QVariant *)(uVar2 | 0x8000000000000000));
    QVariant::~QVariant(&local_58);
  }
  QDataStream::~QDataStream((QDataStream *)&local_78);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar3 == '\0';
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsStore::serializePolicy(const QString &key, const QHstsPolicy &policy)
{
    Q_ASSERT(store.isWritable());

    QByteArray serializedData;
    QDataStream streamer(&serializedData, QIODevice::WriteOnly);
    streamer << policy.expiry().toMSecsSinceEpoch();
    streamer << policy.includesSubDomains();

    if (streamer.status() != QDataStream::Ok)
        return false;

    store.setValue(key, serializedData);
    return true;
}